

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O0

void test_new_delete(char *dir,char *file,vmemcache_repl_p repl_p)

{
  FILE *pFVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char local_1028 [8];
  char nonexistent [4096];
  VMEMcache *cache;
  vmemcache_repl_p repl_p_local;
  char *file_local;
  char *dir_local;
  
  nonexistent._4088_8_ = vmemcache_new();
  vmemcache_set_size(nonexistent._4088_8_,0x100000);
  vmemcache_set_extent_size(nonexistent._4088_8_,0x100);
  vmemcache_set_eviction_policy(nonexistent._4088_8_,repl_p);
  iVar2 = vmemcache_add(nonexistent._4088_8_,dir);
  if (iVar2 != 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0xd9,"test_new_delete");
    pFVar1 = _stderr;
    uVar3 = vmemcache_errormsg();
    fprintf(pFVar1,"vmemcache_new: %s",uVar3);
    fprintf(_stderr,"\n");
    abort();
  }
  vmemcache_delete(nonexistent._4088_8_);
  nonexistent._4088_8_ = vmemcache_new();
  vmemcache_set_size(nonexistent._4088_8_,0x100000);
  vmemcache_set_extent_size(nonexistent._4088_8_,0x100000);
  vmemcache_set_eviction_policy(nonexistent._4088_8_,repl_p);
  iVar2 = vmemcache_add(nonexistent._4088_8_,dir);
  if (iVar2 != 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0xe3,"test_new_delete");
    pFVar1 = _stderr;
    uVar3 = vmemcache_errormsg();
    fprintf(pFVar1,"vmemcache_new: %s",uVar3);
    fprintf(_stderr,"\n");
    abort();
  }
  vmemcache_delete(nonexistent._4088_8_);
  nonexistent._4088_8_ = vmemcache_new();
  iVar2 = vmemcache_set_extent_size(nonexistent._4088_8_,1);
  if (iVar2 == 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0xeb,"test_new_delete");
    fprintf(_stderr,"vmemcache_set_extent_size did not fail with extent_size == 1");
    fprintf(_stderr,"\n");
    abort();
  }
  vmemcache_delete(nonexistent._4088_8_);
  nonexistent._4088_8_ = vmemcache_new();
  vmemcache_set_size(nonexistent._4088_8_,0x100000);
  iVar2 = vmemcache_set_extent_size(nonexistent._4088_8_,0xffffffffffffffff);
  if (iVar2 == 0) {
    iVar2 = vmemcache_add(nonexistent._4088_8_,dir);
    if (iVar2 == 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0xf4,"test_new_delete");
      fprintf(_stderr,"vmemcache_new did not fail with extent_size == -1");
      fprintf(_stderr,"\n");
      abort();
    }
  }
  vmemcache_delete(nonexistent._4088_8_);
  nonexistent._4088_8_ = vmemcache_new();
  iVar2 = vmemcache_set_extent_size(nonexistent._4088_8_,0xff);
  if (iVar2 == 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0xfc,"test_new_delete");
    fprintf(_stderr,"vmemcache_new did not fail with extent_size == VMEMCACHE_MIN_EXTENT - 1");
    fprintf(_stderr,"\n");
    abort();
  }
  vmemcache_delete(nonexistent._4088_8_);
  nonexistent._4088_8_ = vmemcache_new();
  vmemcache_set_size(nonexistent._4088_8_,0x100000);
  iVar2 = vmemcache_set_extent_size(nonexistent._4088_8_,0x100001);
  if (iVar2 == 0) {
    iVar2 = vmemcache_add(nonexistent._4088_8_,dir);
    if (iVar2 == 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x105,"test_new_delete");
      fprintf(_stderr,"vmemcache_new did not fail with extent_size == max_size + 1");
      fprintf(_stderr,"\n");
      abort();
    }
  }
  vmemcache_delete(nonexistent._4088_8_);
  nonexistent._4088_8_ = vmemcache_new();
  iVar2 = vmemcache_set_size(nonexistent._4088_8_,0xfffff);
  if (iVar2 == 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x10d,"test_new_delete");
    fprintf(_stderr,"vmemcache_new did not fail with size == VMEMCACHE_MIN_POOL - 1");
    fprintf(_stderr,"\n");
    abort();
  }
  vmemcache_delete(nonexistent._4088_8_);
  nonexistent._4088_8_ = vmemcache_new();
  iVar2 = vmemcache_set_size(nonexistent._4088_8_,1);
  if (iVar2 == 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x114,"test_new_delete");
    fprintf(_stderr,"vmemcache_new did not fail with size == 1");
    fprintf(_stderr,"\n");
    abort();
  }
  vmemcache_delete(nonexistent._4088_8_);
  nonexistent._4088_8_ = vmemcache_new();
  iVar2 = vmemcache_set_size(nonexistent._4088_8_,0xffffffffffffffff);
  if (iVar2 == 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x11b,"test_new_delete");
    fprintf(_stderr,"vmemcache_new did not fail with size == -1");
    fprintf(_stderr,"\n");
    abort();
  }
  vmemcache_delete(nonexistent._4088_8_);
  nonexistent._4088_8_ = vmemcache_new();
  vmemcache_set_size(nonexistent._4088_8_,0x100000);
  vmemcache_set_extent_size(nonexistent._4088_8_,0x100);
  vmemcache_set_eviction_policy(nonexistent._4088_8_,repl_p);
  iVar2 = vmemcache_add(nonexistent._4088_8_,file);
  if (iVar2 == 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x125,"test_new_delete");
    fprintf(_stderr,"vmemcache_new did not fail with a file instead of a directory");
    fprintf(_stderr,"\n");
    abort();
  }
  pcVar4 = (char *)vmemcache_errormsg();
  iVar2 = strcmp(pcVar4,"open: Not a directory");
  if (iVar2 != 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x12a,"test_new_delete");
    pFVar1 = _stderr;
    uVar3 = vmemcache_errormsg();
    fprintf(pFVar1,"wrong error message: \'%s\' (should be \'open: Not a directory\')",uVar3);
    fprintf(_stderr,"\n");
    abort();
  }
  vmemcache_delete(nonexistent._4088_8_);
  nonexistent._4088_8_ = vmemcache_new();
  vmemcache_set_size(nonexistent._4088_8_,0x100000);
  vmemcache_set_extent_size(nonexistent._4088_8_,0x100);
  vmemcache_set_eviction_policy(nonexistent._4088_8_,repl_p);
  iVar2 = vmemcache_add(nonexistent._4088_8_,0);
  if (iVar2 == 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x134,"test_new_delete");
    fprintf(_stderr,"vmemcache_new did not fail with a NULL directory path");
    fprintf(_stderr,"\n");
    abort();
  }
  pcVar4 = (char *)vmemcache_errormsg();
  iVar2 = strcmp(pcVar4,"invalid (NULL) path");
  if (iVar2 != 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x139,"test_new_delete");
    pFVar1 = _stderr;
    uVar3 = vmemcache_errormsg();
    fprintf(pFVar1,"wrong error message: \'%s\' (should be \'invalid (NULL) path\')",uVar3);
    fprintf(_stderr,"\n");
    abort();
  }
  vmemcache_delete(nonexistent._4088_8_);
  nonexistent._4088_8_ = vmemcache_new();
  vmemcache_set_size(nonexistent._4088_8_,0x100000);
  vmemcache_set_extent_size(nonexistent._4088_8_,0x100);
  vmemcache_set_eviction_policy(nonexistent._4088_8_,repl_p);
  strcpy(local_1028,dir);
  strcat(local_1028,"/nonexistent_dir");
  iVar2 = vmemcache_add(nonexistent._4088_8_,local_1028);
  if (iVar2 == 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x146,"test_new_delete");
    fprintf(_stderr,"vmemcache_new did not fail with a nonexistent directory path");
    fprintf(_stderr,"\n");
    abort();
  }
  vmemcache_delete(nonexistent._4088_8_);
  return;
}

Assistant:

static void
test_new_delete(const char *dir, const char *file, enum vmemcache_repl_p repl_p)
{
	VMEMcache *cache;

	/* TEST #1 - minimum values of max_size and extent_size */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, dir))
		UT_FATAL("vmemcache_new: %s", vmemcache_errormsg());

	vmemcache_delete(cache);

	/* TEST #2 - extent_size = max_size = VMEMCACHE_MIN_POOL */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, dir))
		UT_FATAL("vmemcache_new: %s", vmemcache_errormsg());

	vmemcache_delete(cache);

	/* TEST #3 - extent_size == 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_extent_size(cache, 1))
		UT_FATAL(
			"vmemcache_set_extent_size did not fail with extent_size == 1");

	vmemcache_delete(cache);

	/* TEST #4 - extent_size == -1 */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	if (!vmemcache_set_extent_size(cache, (size_t)-1) &&
		!vmemcache_add(cache, dir)) {
		UT_FATAL("vmemcache_new did not fail with extent_size == -1");
	}
	vmemcache_delete(cache);

	/* TEST #5 - extent_size == VMEMCACHE_MIN_EXTENT - 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT - 1))
		UT_FATAL(
			"vmemcache_new did not fail with extent_size == VMEMCACHE_MIN_EXTENT - 1");
	vmemcache_delete(cache);

	/* TEST #6 - extent_size == max_size + 1 */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	if (!vmemcache_set_extent_size(cache, VMEMCACHE_MIN_POOL + 1) &&
		!vmemcache_add(cache, dir)) {
		UT_FATAL(
			"vmemcache_new did not fail with extent_size == max_size + 1");
	}
	vmemcache_delete(cache);

	/* TEST #7 - size == VMEMCACHE_MIN_POOL - 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_size(cache, VMEMCACHE_MIN_POOL - 1))
		UT_FATAL(
			"vmemcache_new did not fail with size == VMEMCACHE_MIN_POOL - 1");
	vmemcache_delete(cache);

	/* TEST #8 - size == 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_size(cache, 1))
		UT_FATAL(
			"vmemcache_new did not fail with size == 1");
	vmemcache_delete(cache);

	/* TEST #9 - size == -1 */
	cache = vmemcache_new();
	if (!vmemcache_set_size(cache, (size_t)-1))
		UT_FATAL(
			"vmemcache_new did not fail with size == -1");
	vmemcache_delete(cache);

	/* TEST #10 - not a directory, but a file */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (!vmemcache_add(cache, file))
		UT_FATAL(
			"vmemcache_new did not fail with a file instead of a directory");

#define ERR_MSG_1 "open: Not a directory"
	if (strcmp(vmemcache_errormsg(), ERR_MSG_1))
		UT_FATAL("wrong error message: '%s' (should be '"ERR_MSG_1"')",
			vmemcache_errormsg());
	vmemcache_delete(cache);

	/* TEST #11 - NULL directory path */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (!vmemcache_add(cache, NULL))
		UT_FATAL(
			"vmemcache_new did not fail with a NULL directory path");

#define ERR_MSG_2 "invalid (NULL) path"
	if (strcmp(vmemcache_errormsg(), ERR_MSG_2))
		UT_FATAL("wrong error message: '%s' (should be '"ERR_MSG_2"')",
			vmemcache_errormsg());
	vmemcache_delete(cache);

	/* TEST #12 - nonexistent directory path */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	char nonexistent[PATH_MAX];
	strcpy(nonexistent, dir);
	strcat(nonexistent, "/nonexistent_dir");
	if (!vmemcache_add(cache, nonexistent))
		UT_FATAL(
			"vmemcache_new did not fail with a nonexistent directory path");
	vmemcache_delete(cache);
}